

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O0

void __thiscall Atari2600::TIA::output_for_cycles(TIA *this,int number_of_cycles)

{
  int iVar1;
  int *piVar2;
  uint16_t *puVar3;
  bool local_35;
  int local_30;
  int data_length_1;
  int local_28;
  int duration;
  int data_length;
  int latent_end;
  int latent_start;
  int iStack_14;
  bool is_reset;
  int output_cursor;
  int number_of_cycles_local;
  TIA *this_local;
  
  latent_start = this->horizontal_counter_;
  this->horizontal_counter_ = number_of_cycles + this->horizontal_counter_;
  local_35 = false;
  if (latent_start < 0xe0) {
    local_35 = 0xdf < this->horizontal_counter_;
  }
  latent_end._3_1_ = local_35;
  iStack_14 = number_of_cycles;
  _output_cursor = this;
  if (latent_start == 0) {
    memset(this->collision_buffer_,0,0xa0);
    (this->ball_).super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time =
         (this->ball_).super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time %
         0xe4;
    this->player_[0].super_Object<Atari2600::TIA::Player>.motion_time =
         this->player_[0].super_Object<Atari2600::TIA::Player>.motion_time % 0xe4;
    this->player_[1].super_Object<Atari2600::TIA::Player>.motion_time =
         this->player_[1].super_Object<Atari2600::TIA::Player>.motion_time % 0xe4;
    this->missile_[0].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time =
         this->missile_[0].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.
         motion_time % 0xe4;
    this->missile_[1].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time =
         this->missile_[1].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.
         motion_time % 0xe4;
  }
  data_length = latent_start + 4;
  duration = this->horizontal_counter_ + 4;
  draw_playfield(this,data_length,duration);
  draw_object<Atari2600::TIA::Player>
            (this,this->player_,'\x04',latent_start,this->horizontal_counter_);
  draw_object<Atari2600::TIA::Player>
            (this,this->player_ + 1,'\b',latent_start,this->horizontal_counter_);
  draw_missile(this,this->missile_,this->player_,'\x10',latent_start,this->horizontal_counter_);
  draw_missile(this,this->missile_ + 1,this->player_ + 1,' ',latent_start,this->horizontal_counter_)
  ;
  draw_object<Atari2600::TIA::Ball>(this,&this->ball_,'\x02',latent_start,this->horizontal_counter_)
  ;
  if ((this->output_mode_ | 2U) == 3) {
    if (latent_start < 0x10) {
      if (this->horizontal_counter_ < 0x11) {
        Outputs::CRT::CRT::output_sync(&this->crt_,(this->horizontal_counter_ - latent_start) * 2);
        this->horizontal_counter_ = this->horizontal_counter_ % 0xe4;
        return;
      }
      Outputs::CRT::CRT::output_sync(&this->crt_,(0x10 - latent_start) * 2);
      latent_start = 0x10;
    }
    if (latent_start < 0x20) {
      if (this->horizontal_counter_ < 0x21) {
        Outputs::CRT::CRT::output_blank(&this->crt_,(this->horizontal_counter_ - latent_start) * 2);
        this->horizontal_counter_ = this->horizontal_counter_ % 0xe4;
        return;
      }
      Outputs::CRT::CRT::output_blank(&this->crt_,(0x20 - latent_start) * 2);
      latent_start = 0x20;
    }
    if (latent_start < 0x30) {
      if (this->horizontal_counter_ < 0x31) {
        Outputs::CRT::CRT::output_default_colour_burst
                  (&this->crt_,(this->horizontal_counter_ - latent_start) * 2,')');
        this->horizontal_counter_ = this->horizontal_counter_ % 0xe4;
        return;
      }
      Outputs::CRT::CRT::output_default_colour_burst(&this->crt_,(0x30 - latent_start) * 2,')');
      latent_start = 0x30;
    }
    if (latent_start < 0xe4) {
      if (this->horizontal_counter_ < 0xe5) {
        Outputs::CRT::CRT::output_sync(&this->crt_,(this->horizontal_counter_ - latent_start) * 2);
        this->horizontal_counter_ = this->horizontal_counter_ % 0xe4;
        return;
      }
      Outputs::CRT::CRT::output_sync(&this->crt_,(0xe4 - latent_start) * 2);
      latent_start = 0xe4;
    }
  }
  else {
    if (latent_start < 0x10) {
      if (this->horizontal_counter_ < 0x11) {
        Outputs::CRT::CRT::output_blank(&this->crt_,(this->horizontal_counter_ - latent_start) * 2);
        this->horizontal_counter_ = this->horizontal_counter_ % 0xe4;
        return;
      }
      Outputs::CRT::CRT::output_blank(&this->crt_,(0x10 - latent_start) * 2);
      latent_start = 0x10;
    }
    if (latent_start < 0x20) {
      if (this->horizontal_counter_ < 0x21) {
        Outputs::CRT::CRT::output_sync(&this->crt_,(this->horizontal_counter_ - latent_start) * 2);
        this->horizontal_counter_ = this->horizontal_counter_ % 0xe4;
        return;
      }
      Outputs::CRT::CRT::output_sync(&this->crt_,(0x20 - latent_start) * 2);
      latent_start = 0x20;
    }
    if (latent_start < 0x30) {
      if (this->horizontal_counter_ < 0x31) {
        Outputs::CRT::CRT::output_default_colour_burst
                  (&this->crt_,(this->horizontal_counter_ - latent_start) * 2,')');
        this->horizontal_counter_ = this->horizontal_counter_ % 0xe4;
        return;
      }
      Outputs::CRT::CRT::output_default_colour_burst(&this->crt_,(0x30 - latent_start) * 2,')');
      latent_start = 0x30;
    }
    if (latent_start < 0x44) {
      if (this->horizontal_counter_ < 0x45) {
        Outputs::CRT::CRT::output_blank(&this->crt_,(this->horizontal_counter_ - latent_start) * 2);
        this->horizontal_counter_ = this->horizontal_counter_ % 0xe4;
        return;
      }
      Outputs::CRT::CRT::output_blank(&this->crt_,(0x44 - latent_start) * 2);
      latent_start = 0x44;
    }
  }
  if ((this->output_mode_ & 2U) == 0) {
    if (this->pixels_start_location_ == 0) {
      this->pixels_start_location_ = latent_start;
      puVar3 = (uint16_t *)Outputs::CRT::CRT::begin_data(&this->crt_,0xa0,1);
      this->pixel_target_ = puVar3;
    }
    if (this->pixel_target_ != (uint16_t *)0x0) {
      output_pixels(this,latent_start,this->horizontal_counter_);
    }
    for (; latent_start < this->horizontal_counter_; latent_start = latent_start + 1) {
      this->collision_flags_ =
           this->collision_flags_by_buffer_vaules_[this->collision_buffer_[latent_start + -0x44]] |
           this->collision_flags_;
    }
    if (this->horizontal_counter_ == 0xe4) {
      iVar1 = latent_start - this->pixels_start_location_;
      Outputs::CRT::CRT::output_data(&this->crt_,iVar1 * 2,(long)iVar1);
      this->pixel_target_ = (uint16_t *)0x0;
      this->pixels_start_location_ = 0;
    }
  }
  else {
    if (this->pixel_target_ != (uint16_t *)0x0) {
      output_pixels(this,this->pixels_start_location_,latent_start);
      local_28 = latent_start - this->pixels_start_location_;
      Outputs::CRT::CRT::output_data(&this->crt_,local_28 * 2,(long)local_28);
      this->pixel_target_ = (uint16_t *)0x0;
      this->pixels_start_location_ = 0;
    }
    local_30 = 0xe4;
    piVar2 = std::min<int>(&local_30,&this->horizontal_counter_);
    data_length_1 = *piVar2 - latent_start;
    Outputs::CRT::CRT::output_blank(&this->crt_,data_length_1 * 2);
  }
  if ((latent_end._3_1_ & 1) != 0) {
    this->horizontal_blank_extend_ = false;
  }
  this->horizontal_counter_ = this->horizontal_counter_ % 0xe4;
  return;
}

Assistant:

void TIA::output_for_cycles(int number_of_cycles) {
	/*
		Line timing is oriented around 0 being the start of the right-hand side vertical blank;
		a wsync synchronises the CPU to horizontal_counter_ = 0. All timing below is in terms of the
		NTSC colour clock.

		Therefore, each line is composed of:

			16 cycles:	blank					; -> 16
			16 cycles:	sync					; -> 32
			16 cycles:	colour burst			; -> 48
			20 cycles:	blank					; -> 68
			8 cycles:	blank or pixels, depending on whether the blank extend bit is set
			152 cycles:	pixels
	*/
	int output_cursor = horizontal_counter_;
	horizontal_counter_ += number_of_cycles;
	bool is_reset = output_cursor < 224 && horizontal_counter_ >= 224;

	if(!output_cursor) {
		std::memset(collision_buffer_, 0, sizeof(collision_buffer_));

		ball_.motion_time %= 228;
		player_[0].motion_time %= 228;
		player_[1].motion_time %= 228;
		missile_[0].motion_time %= 228;
		missile_[1].motion_time %= 228;
	}

	// accumulate an OR'd version of the output into the collision buffer
	int latent_start = output_cursor + 4;
	int latent_end = horizontal_counter_ + 4;
	draw_playfield(latent_start, latent_end);
	draw_object<Player>(player_[0], uint8_t(CollisionType::Player0), output_cursor, horizontal_counter_);
	draw_object<Player>(player_[1], uint8_t(CollisionType::Player1), output_cursor, horizontal_counter_);
	draw_missile(missile_[0], player_[0], uint8_t(CollisionType::Missile0), output_cursor, horizontal_counter_);
	draw_missile(missile_[1], player_[1], uint8_t(CollisionType::Missile1), output_cursor, horizontal_counter_);
	draw_object<Ball>(ball_, uint8_t(CollisionType::Ball), output_cursor, horizontal_counter_);

	// convert to television signals

#define Period(function, target)	\
	if(output_cursor < target) { \
		if(horizontal_counter_ <= target) { \
			crt_.function((horizontal_counter_ - output_cursor) * 2); \
			horizontal_counter_ %= cycles_per_line; \
			return; \
		} else { \
			crt_.function((target - output_cursor) * 2); \
			output_cursor = target; \
		} \
	}

	switch(output_mode_) {
		default:
			Period(output_blank, 16)
			Period(output_sync, 32)
			Period(output_default_colour_burst, 48)
			Period(output_blank, 68)
		break;
		case sync_flag:
		case sync_flag | blank_flag:
			Period(output_sync, 16)
			Period(output_blank, 32)
			Period(output_default_colour_burst, 48)
			Period(output_sync, 228)
		break;
	}

#undef Period

	if(output_mode_ & blank_flag) {
		if(pixel_target_) {
			output_pixels(pixels_start_location_, output_cursor);
			const int data_length = int(output_cursor - pixels_start_location_);
			crt_.output_data(data_length * 2, size_t(data_length));
			pixel_target_ = nullptr;
			pixels_start_location_ = 0;
		}
		int duration = std::min(228, horizontal_counter_) - output_cursor;
		crt_.output_blank(duration * 2);
	} else {
		if(!pixels_start_location_) {
			pixels_start_location_ = output_cursor;
			pixel_target_ = reinterpret_cast<uint16_t *>(crt_.begin_data(160));
		}

		// convert that into pixels
		if(pixel_target_) output_pixels(output_cursor, horizontal_counter_);

		// accumulate collision flags
		while(output_cursor < horizontal_counter_) {
			collision_flags_ |= collision_flags_by_buffer_vaules_[collision_buffer_[output_cursor - first_pixel_cycle]];
			output_cursor++;
		}

		if(horizontal_counter_ == cycles_per_line) {
			const int data_length = int(output_cursor - pixels_start_location_);
			crt_.output_data(data_length * 2, size_t(data_length));
			pixel_target_ = nullptr;
			pixels_start_location_ = 0;
		}
	}

	if(is_reset) horizontal_blank_extend_ = false;

	horizontal_counter_ %= cycles_per_line;
}